

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpClient.cpp
# Opt level: O0

void __thiscall
sznet::net::KcpWithTcpClient::KcpWithTcpClient
          (KcpWithTcpClient *this,EventLoop *loop,InetAddress *tcpServerAddr,string *nameArg,
          int kcpMode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  LogLevel LVar4;
  EventLoop *pEVar5;
  Connector *pCVar6;
  element_type *this_00;
  LogStream *this_01;
  self *psVar7;
  EventLoop *in_R9;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_10d0 [12];
  Logger local_10c0;
  KcpWithTcpClient *local_f0;
  code *local_e8;
  undefined8 local_e0;
  type local_d8;
  NewConnectionCallback local_c0;
  KcpWithTcpClient *local_a0;
  code *local_98;
  undefined8 local_90;
  type local_88;
  StringMessageCallback local_70;
  SourceFile local_40;
  int local_2c;
  string *psStack_28;
  int kcpMode_local;
  string *nameArg_local;
  InetAddress *tcpServerAddr_local;
  EventLoop *loop_local;
  KcpWithTcpClient *this_local;
  
  local_2c = kcpMode;
  psStack_28 = nameArg;
  nameArg_local = (string *)tcpServerAddr;
  tcpServerAddr_local = (InetAddress *)loop;
  loop_local = (EventLoop *)this;
  Logger::SourceFile::SourceFile<107>
            (&local_40,
             (char (*) [107])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
            );
  file.m_data = (char *)(ulong)(uint)local_40.m_size;
  file._8_8_ = 0x29;
  pEVar5 = CheckNotNull<sznet::net::EventLoop>
                     ((sznet *)local_40.m_data,file,0x1ae8a5,(char *)tcpServerAddr_local,in_R9);
  this->m_loop = pEVar5;
  pCVar6 = (Connector *)operator_new(0x70);
  Connector::Connector(pCVar6,(EventLoop *)tcpServerAddr_local,(InetAddress *)nameArg_local);
  std::shared_ptr<sznet::net::Connector>::shared_ptr<sznet::net::Connector,void>
            (&this->m_tcpConnector,pCVar6);
  std::__cxx11::string::string((string *)&this->m_name,(string *)psStack_28);
  std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&)>::
  function<void(&)(std::shared_ptr<sznet::net::KcpConnection>const&),void>
            ((function<void(std::shared_ptr<sznet::net::KcpConnection>const&)> *)
             &this->m_kcpConnectionCallback,defaultKcpConnectionCallback);
  std::
  function<void(std::shared_ptr<sznet::net::KcpConnection>const&,sznet::net::Buffer*,sznet::Timestamp)>
  ::
  function<void(&)(std::shared_ptr<sznet::net::KcpConnection>const&,sznet::net::Buffer*,sznet::Timestamp),void>
            ((function<void(std::shared_ptr<sznet::net::KcpConnection>const&,sznet::net::Buffer*,sznet::Timestamp)>
              *)&this->m_kcpMessageCallback,defaultKcpMessageCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::function
            (&this->m_kcpWriteCompleteCallback);
  std::atomic<bool>::atomic(&this->m_tcpRetry,false);
  std::atomic<bool>::atomic(&this->m_tcpConnect,true);
  this->m_nextConnId = 1;
  MutexLock::MutexLock(&this->m_mutex);
  std::shared_ptr<sznet::net::TcpConnection>::shared_ptr(&this->m_tcpConnection);
  local_98 = handleTcpMessage;
  local_90 = 0;
  local_a0 = this;
  std::
  bind<void(sznet::net::KcpWithTcpClient::*)(std::shared_ptr<sznet::net::TcpConnection>const&,std::__cxx11::string_const&,sznet::Timestamp),sznet::net::KcpWithTcpClient*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
            (&local_88,(offset_in_KcpWithTcpClient_to_subr *)&local_98,&local_a0,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2,
             (_Placeholder<3> *)&std::placeholders::_3);
  std::
  function<void(std::shared_ptr<sznet::net::TcpConnection>const&,std::__cxx11::string_const&,sznet::Timestamp)>
  ::
  function<std::_Bind<void(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(std::shared_ptr<sznet::net::TcpConnection>const&,std::__cxx11::string_const&,sznet::Timestamp)>,void>
            ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&,std::__cxx11::string_const&,sznet::Timestamp)>
              *)&local_70,&local_88);
  LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>::LengthHeaderCodec
            (&this->m_tcpCodec,&local_70);
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
  ::~function(&local_70);
  uVar1 = *(undefined8 *)nameArg_local;
  uVar2 = *(undefined8 *)(nameArg_local + 8);
  uVar3 = *(undefined8 *)(nameArg_local + 0x14);
  *(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 0xc) =
       *(undefined8 *)(nameArg_local + 0xc);
  *(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 0x14) = uVar3;
  *(undefined8 *)&(this->m_udpListenAddr).field_0 = uVar1;
  *(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 8) = uVar2;
  std::shared_ptr<sznet::net::KcpConnection>::shared_ptr(&this->m_kcpConnection);
  this->m_kcpMode = local_2c;
  this_00 = std::
            __shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_tcpConnector);
  local_e8 = newTcpConnection;
  local_e0 = 0;
  local_f0 = this;
  std::
  bind<void(sznet::net::KcpWithTcpClient::*)(int),sznet::net::KcpWithTcpClient*,std::_Placeholder<1>const&>
            (&local_d8,(offset_in_KcpWithTcpClient_to_subr *)&local_e8,&local_f0,
             (_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(int)>::
  function<std::_Bind<void(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient*,std::_Placeholder<1>))(int)>,void>
            ((function<void(int)> *)&local_c0,&local_d8);
  Connector::setNewConnectionCallback(this_00,&local_c0);
  std::function<void_(int)>::~function(&local_c0);
  LVar4 = Logger::logLevel();
  if ((int)LVar4 < 3) {
    Logger::SourceFile::SourceFile<107>
              ((SourceFile *)local_10d0,
               (char (*) [107])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_10d0._0_8_;
    file_00.m_size = local_10d0._8_4_;
    Logger::Logger(&local_10c0,file_00,0x37);
    this_01 = Logger::stream(&local_10c0);
    psVar7 = LogStream::operator<<(this_01,"KcpWithTcpClient::KcpWithTcpClient[");
    psVar7 = LogStream::operator<<(psVar7,&this->m_name);
    psVar7 = LogStream::operator<<(psVar7,"] - tcp connector ");
    pCVar6 = get_pointer<sznet::net::Connector>(&this->m_tcpConnector);
    LogStream::operator<<(psVar7,pCVar6);
    Logger::~Logger(&local_10c0);
  }
  return;
}

Assistant:

KcpWithTcpClient::KcpWithTcpClient(EventLoop* loop, const InetAddress& tcpServerAddr, const string& nameArg, int kcpMode):
	m_loop(CHECK_NOTNULL(loop)),
	m_tcpConnector(new Connector(loop, tcpServerAddr)),
    m_name(nameArg),
    m_kcpConnectionCallback(defaultKcpConnectionCallback),
    m_kcpMessageCallback(defaultKcpMessageCallback),
    m_tcpRetry(false),
    m_tcpConnect(true),
    m_nextConnId(1),
	m_tcpCodec(std::bind(&KcpWithTcpClient::handleTcpMessage, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3)),
	m_udpListenAddr(tcpServerAddr),
	m_kcpMode(kcpMode)
{
	m_tcpConnector->setNewConnectionCallback(std::bind(&KcpWithTcpClient::newTcpConnection, this, std::placeholders::_1));
	// FIXME setConnectFailedCallback
	LOG_INFO << "KcpWithTcpClient::KcpWithTcpClient[" << m_name 
		<< "] - tcp connector " << get_pointer(m_tcpConnector);
}